

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O0

void __thiscall
tvm::runtime::WorkspacePool::Pool::Release(Pool *this,TVMContext ctx,DeviceAPI *device)

{
  LogCheckError LVar1;
  bool bVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  ulong local_1d8;
  size_t i;
  int local_34;
  size_type local_30;
  LogCheckError local_28;
  LogCheckError _check_err;
  DeviceAPI *device_local;
  Pool *this_local;
  TVMContext ctx_local;
  
  _check_err.str = (string *)device;
  local_30 = std::
             vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ::size(&this->allocated_);
  local_34 = 1;
  dmlc::LogCheck_EQ<unsigned_long,int>((dmlc *)&local_28,&local_30,&local_34);
  bVar2 = dmlc::LogCheckError::operator_cast_to_bool(&local_28);
  if (bVar2) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&i,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
               ,0x77);
    poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&i);
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: ");
    poVar4 = std::operator<<(poVar4,"allocated_.size() == 1");
    poVar4 = std::operator<<(poVar4,(string *)local_28.str);
    std::operator<<(poVar4,": ");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&i);
  }
  dmlc::LogCheckError::~LogCheckError(&local_28);
  for (local_1d8 = 1;
      sVar5 = std::
              vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
              ::size(&this->free_list_), LVar1 = _check_err, local_1d8 < sVar5;
      local_1d8 = local_1d8 + 1) {
    pvVar6 = std::
             vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             ::operator[](&this->free_list_,local_1d8);
    (**(code **)(*(long *)LVar1.str + 0x28))(LVar1.str,ctx,pvVar6->data);
  }
  std::
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  ::clear(&this->free_list_);
  return;
}

Assistant:

void Release(TVMContext ctx, DeviceAPI *device) {
    CHECK_EQ(allocated_.size(), 1);
    for (size_t i = 1; i < free_list_.size(); ++i) {
      device->FreeDataSpace(ctx, free_list_[i].data);
    }
    free_list_.clear();
  }